

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O0

void * t64watchfun(void *x)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint uVar3;
  uint local_14;
  uint32_t nval;
  uint32_t val;
  void *x_local;
  
  local_14 = nva_rd32(cnum,a);
  queue[put] = local_14;
  uVar2 = get_time(cnum);
  tqueue64[put] = uVar2;
  put = (put + 1) % 0x100000;
  do {
    do {
      uVar1 = nva_rd32(cnum,a);
      uVar3 = local_14 & mask;
      local_14 = uVar1;
    } while ((uVar1 & mask) == uVar3);
    queue[put] = uVar1;
    uVar2 = get_time(cnum);
    tqueue64[put] = uVar2;
    put = (put + 1) % 0x100000;
  } while( true );
}

Assistant:

void *t64watchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	tqueue64[put] = get_time(cnum);
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			tqueue64[put] = get_time(cnum);
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}